

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

TRef recff_io_fp(jit_State *J,TRef *udp,int32_t id)

{
  TRef TVar1;
  TRef TVar2;
  uint local_64;
  TRef fp;
  TRef ud;
  TRef tr;
  int32_t id_local;
  TRef *udp_local;
  jit_State *J_local;
  
  if (id == 0) {
    local_64 = *J->base;
    if ((local_64 & 0x1f000000) != 0xc000000) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    (J->fold).ins.field_0.ot = 0x4510;
    (J->fold).ins.field_0.op1 = (IRRef1)local_64;
    (J->fold).ins.field_0.op2 = 0xc;
    TVar1 = lj_opt_fold(J);
    TVar2 = lj_ir_kint(J,1);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold(J);
  }
  else {
    local_64 = lj_ir_ggfload(J,IRT_UDATA,(long)(id * 8 + 0x208));
  }
  *udp = local_64;
  (J->fold).ins.field_0.ot = 0x4509;
  (J->fold).ins.field_0.op1 = (IRRef1)local_64;
  (J->fold).ins.field_0.op2 = 0xd;
  TVar1 = lj_opt_fold(J);
  TVar2 = lj_ir_knull(J,IRT_P64);
  (J->fold).ins.field_0.ot = 0x989;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  lj_opt_fold(J);
  return TVar1;
}

Assistant:

static TRef recff_io_fp(jit_State *J, TRef *udp, int32_t id)
{
  TRef tr, ud, fp;
  if (id) {  /* io.func() */
    ud = lj_ir_ggfload(J, IRT_UDATA, GG_OFS(g.gcroot[id]));
  } else {  /* fp:method() */
    ud = J->base[0];
    if (!tref_isudata(ud))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    tr = emitir(IRT(IR_FLOAD, IRT_U8), ud, IRFL_UDATA_UDTYPE);
    emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, UDTYPE_IO_FILE));
  }
  *udp = ud;
  fp = emitir(IRT(IR_FLOAD, IRT_PTR), ud, IRFL_UDATA_FILE);
  emitir(IRTG(IR_NE, IRT_PTR), fp, lj_ir_knull(J, IRT_PTR));
  return fp;
}